

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O1

spair * __thiscall badlywrapped<spair>::get(spair *__return_storage_ptr__,badlywrapped<spair> *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  pcVar1 = (this->value).first._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->value).first._M_string_length);
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  pcVar1 = (this->value).second._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->second,pcVar1,
             pcVar1 + (this->value).second._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD T get() const { return value; }